

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

shared_ptr<QPDFLogger> QPDFLogger::defaultLogger(void)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<QPDFLogger> sVar2;
  
  if (defaultLogger()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&defaultLogger()::l);
    if (iVar1 != 0) {
      create();
      __cxa_atexit(std::shared_ptr<QPDFLogger>::~shared_ptr,&defaultLogger::l,&__dso_handle);
      __cxa_guard_release(&defaultLogger()::l);
    }
  }
  std::shared_ptr<QPDFLogger>::shared_ptr((shared_ptr<QPDFLogger> *)in_RDI,&defaultLogger::l);
  sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<QPDFLogger>)sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFLogger>
QPDFLogger::defaultLogger()
{
    static auto l = create();
    return l;
}